

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void test_sha256_eq(secp256k1_sha256 *sha1,secp256k1_sha256 *sha2)

{
  int iVar1;
  void *in_RSI;
  void *in_RDI;
  
  if ((*(ulong *)((long)in_RDI + 0x60) & 0x3f) != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x30d,"test condition failed: (sha1->bytes & 0x3F) == 0");
    abort();
  }
  if (*(long *)((long)in_RDI + 0x60) != *(long *)((long)in_RSI + 0x60)) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x30f,"test condition failed: sha1->bytes == sha2->bytes");
    abort();
  }
  iVar1 = secp256k1_memcmp_var(in_RDI,in_RSI,0x20);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x310,
            "test condition failed: secp256k1_memcmp_var(sha1->s, sha2->s, sizeof(sha1->s)) == 0");
    abort();
  }
  return;
}

Assistant:

static void test_sha256_eq(const secp256k1_sha256 *sha1, const secp256k1_sha256 *sha2) {
    /* Is buffer fully consumed? */
    CHECK((sha1->bytes & 0x3F) == 0);

    CHECK(sha1->bytes == sha2->bytes);
    CHECK(secp256k1_memcmp_var(sha1->s, sha2->s, sizeof(sha1->s)) == 0);
}